

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_GetAddressByHash_Test::~AddressFactory_GetAddressByHash_Test
          (AddressFactory_GetAddressByHash_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByHash)
{
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd")), CfdException);
    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData()), CfdException);
  }
}